

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::formatter<fmt::v5::basic_string_view<char>,char,void>::
parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
          (formatter<fmt::v5::basic_string_view<char>,char,void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  null_terminating_iterator<char> it_00;
  char spec;
  char *pcVar1;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *in_RCX;
  null_terminating_iterator<char> nVar2;
  error_handler local_92;
  cstring_type_checker<fmt::v5::internal::error_handler> local_91;
  error_handler local_90;
  float_type_checker<fmt::v5::internal::error_handler> local_8f;
  error_handler local_8e;
  char_specs_checker<fmt::v5::internal::error_handler,_char> local_8d;
  error_handler local_8c;
  int_type_checker<fmt::v5::internal::error_handler> local_8b;
  undefined1 local_8a [8];
  error_handler eh;
  char type_spec;
  char *local_78;
  char *pcStack_70;
  dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  local_68;
  undefined1 local_50 [8];
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  handler;
  undefined1 auStack_28 [4];
  type type;
  null_terminating_iterator<char> it;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx_local;
  formatter<fmt::v5::basic_string_view<char>,_char,_void> *this_local;
  
  it.end_ = (char *)ctx;
  internal::null_terminating_iterator<char>::
  null_terminating_iterator<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
            ((null_terminating_iterator<char> *)auStack_28,ctx);
  handler._28_4_ = 0xb;
  internal::
  dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>::
  dynamic_specs_handler
            (&local_68,(dynamic_format_specs<char> *)this,
             (basic_parse_context<char,_fmt::v5::internal::error_handler> *)it.end_);
  internal::
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  ::specs_checker((specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
                   *)local_50,&local_68,handler._28_4_);
  stack0xffffffffffffff78 = _auStack_28;
  nVar2.end_ = (char *)local_50;
  nVar2.ptr_ = it.ptr_;
  nVar2 = internal::
          parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                    (_auStack_28,nVar2,in_RCX);
  local_78 = nVar2.ptr_;
  pcStack_70 = nVar2.end_;
  _auStack_28 = (internal *)local_78;
  it.ptr_ = pcStack_70;
  local_8a[1] = basic_format_specs<char>::type((basic_format_specs<char> *)this);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::error_handler
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)local_8a);
  spec = local_8a[1];
  switch(handler._28_4_) {
  case (BADTYPE)0x0:
  case (BADTYPE)0x1:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                  ,0xc4f,
                  "typename ParseContext::iterator fmt::formatter<fmt::basic_string_view<char>>::parse(ParseContext &) [T = fmt::basic_string_view<char>, Char = char, Enable = void, ParseContext = fmt::basic_parse_context<char>]"
                 );
  case (BADTYPE)0x2:
  case (BADTYPE)0x3:
  case (BADTYPE)0x4:
  case (BADTYPE)0x5:
  case (BADTYPE)0x6:
    internal::error_handler::error_handler(&local_8c,(error_handler *)local_8a);
    internal::int_type_checker<fmt::v5::internal::error_handler>::int_type_checker
              (&local_8b,&local_8c);
    internal::
    handle_int_type_spec<char,fmt::v5::internal::int_type_checker<fmt::v5::internal::error_handler>>
              (spec,&local_8b);
    break;
  case (BADTYPE)0x7:
    internal::error_handler::error_handler(&local_8e,(error_handler *)local_8a);
    internal::char_specs_checker<fmt::v5::internal::error_handler,_char>::char_specs_checker
              (&local_8d,(int)spec,&local_8e);
    internal::
    handle_char_specs<char,fmt::v5::internal::char_specs_checker<fmt::v5::internal::error_handler,char>>
              ((basic_format_specs<char> *)this,&local_8d);
    break;
  case (BADTYPE)0x8:
  case (BADTYPE)0x9:
    internal::error_handler::error_handler(&local_90,(error_handler *)local_8a);
    internal::float_type_checker<fmt::v5::internal::error_handler>::float_type_checker
              (&local_8f,&local_90);
    internal::
    handle_float_type_spec<char,fmt::v5::internal::float_type_checker<fmt::v5::internal::error_handler>>
              (spec,&local_8f);
    break;
  case (BADTYPE)0xa:
    internal::error_handler::error_handler(&local_92,(error_handler *)local_8a);
    internal::cstring_type_checker<fmt::v5::internal::error_handler>::cstring_type_checker
              (&local_91,&local_92);
    internal::
    handle_cstring_type_spec<char,fmt::v5::internal::cstring_type_checker<fmt::v5::internal::error_handler>>
              (spec,&local_91);
    break;
  case (BADTYPE)0xb:
    internal::check_string_type_spec<char,fmt::v5::internal::error_handler&>
              (local_8a[1],(error_handler *)local_8a);
    break;
  case (BADTYPE)0xc:
    internal::check_pointer_type_spec<char,fmt::v5::internal::error_handler&>
              (local_8a[1],(error_handler *)local_8a);
    break;
  case (BADTYPE)0xd:
  }
  it_00.end_ = it.ptr_;
  it_00.ptr_ = (char *)_auStack_28;
  pcVar1 = internal::pointer_from<char>(it_00);
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR typename ParseContext::iterator parse(ParseContext &ctx) {
    auto it = internal::null_terminating_iterator<Char>(ctx);
    typedef internal::dynamic_specs_handler<ParseContext> handler_type;
    auto type = internal::get_type<
      typename buffer_context<Char>::type, T>::value;
    internal::specs_checker<handler_type>
        handler(handler_type(specs_, ctx), type);
    it = parse_format_specs(it, handler);
    auto type_spec = specs_.type();
    auto eh = ctx.error_handler();
    switch (type) {
    case internal::none_type:
    case internal::named_arg_type:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case internal::int_type:
    case internal::uint_type:
    case internal::long_long_type:
    case internal::ulong_long_type:
    case internal::bool_type:
      handle_int_type_spec(
            type_spec, internal::int_type_checker<decltype(eh)>(eh));
      break;
    case internal::char_type:
      handle_char_specs(
          &specs_,
          internal::char_specs_checker<decltype(eh), decltype(type_spec)>(
              type_spec, eh));
      break;
    case internal::double_type:
    case internal::long_double_type:
      handle_float_type_spec(
            type_spec, internal::float_type_checker<decltype(eh)>(eh));
      break;
    case internal::cstring_type:
      internal::handle_cstring_type_spec(
            type_spec, internal::cstring_type_checker<decltype(eh)>(eh));
      break;
    case internal::string_type:
      internal::check_string_type_spec(type_spec, eh);
      break;
    case internal::pointer_type:
      internal::check_pointer_type_spec(type_spec, eh);
      break;
    case internal::custom_type:
      // Custom format specifiers should be checked in parse functions of
      // formatter specializations.
      break;
    }
    return pointer_from(it);
  }